

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mpi_montmul(mbedtls_mpi *A,mbedtls_mpi *B,mbedtls_mpi *N,mbedtls_mpi_uint mm,mbedtls_mpi *T)

{
  size_t i;
  mbedtls_mpi_uint b;
  mbedtls_mpi_uint mVar1;
  mbedtls_mpi_uint mVar2;
  int iVar3;
  mbedtls_mpi *B_00;
  mbedtls_mpi_uint *d;
  ulong i_00;
  mbedtls_mpi_uint *__src;
  size_t sVar4;
  
  iVar3 = -4;
  if ((N->n + 1 <= T->n) && (T->p != (mbedtls_mpi_uint *)0x0)) {
    memset(T->p,0,T->n << 3);
    __src = T->p;
    i = N->n;
    i_00 = B->n;
    if (i <= B->n) {
      i_00 = i;
    }
    if (i != 0) {
      sVar4 = 0;
      d = __src;
      do {
        b = A->p[sVar4];
        mVar1 = *B->p;
        mVar2 = *d;
        mpi_mul_hlp(i_00,B->p,d,b);
        mpi_mul_hlp(i,N->p,d,(mVar1 * b + mVar2) * mm);
        __src = d + 1;
        *d = b;
        d[i + 2] = 0;
        sVar4 = sVar4 + 1;
        d = __src;
      } while (i != sVar4);
    }
    memcpy(A->p,__src,i * 8 + 8);
    iVar3 = mbedtls_mpi_cmp_abs(A,N);
    B_00 = A;
    if (-1 < iVar3) {
      B_00 = N;
      T = A;
    }
    mpi_sub_hlp(T,T,B_00);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int mpi_montmul( mbedtls_mpi *A, const mbedtls_mpi *B, const mbedtls_mpi *N, mbedtls_mpi_uint mm,
                         mbedtls_mpi *T )
{
    size_t i, n, m;
    mbedtls_mpi_uint u0, u1, *d;

    if( T->n < N->n + 1 || T->p == NULL )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    memset( T->p, 0, T->n * ciL );

    d = T->p;
    n = N->n;
    m = ( B->n < n ) ? B->n : n;

    for( i = 0; i < n; i++ )
    {
        /*
         * T = (T + u0*B + u1*N) / 2^biL
         */
        u0 = A->p[i];
        u1 = ( d[0] + u0 * B->p[0] ) * mm;

        mpi_mul_hlp( m, B->p, d, u0 );
        mpi_mul_hlp( n, N->p, d, u1 );

        *d++ = u0; d[n + 1] = 0;
    }

    memcpy( A->p, d, ( n + 1 ) * ciL );

    if( mbedtls_mpi_cmp_abs( A, N ) >= 0 )
        mpi_sub_hlp( A, A, N );
    else
        /* prevent timing attacks */
        mpi_sub_hlp( T, T, A );

    return( 0 );
}